

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double betainv(double alpha,double p,double q)

{
  bool bVar1;
  double dVar2;
  double y_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double beta;
  double yprev;
  double y;
  double xin;
  double w;
  double value;
  double tx;
  double t;
  double sq;
  double sae;
  double s;
  double r;
  double qq;
  double prev;
  double pp;
  int indx;
  int iex;
  double h;
  double g;
  double fpu;
  double adj;
  double acu;
  double a;
  double q_local;
  double p_local;
  double alpha_local;
  
  dVar2 = beta_log(p,q);
  y_00 = pow(10.0,-37.0);
  if ((p < 0.0) || (q < 0.0)) {
    printf("parameters should be non-negatve and real");
    exit(1);
  }
  if ((0.0 <= alpha) && (alpha <= 1.0)) {
    if ((alpha != 0.0) || (NAN(alpha))) {
      if ((alpha != 1.0) || (NAN(alpha))) {
        bVar1 = 0.5 < alpha;
        r = q;
        prev = p;
        acu = alpha;
        if (bVar1) {
          acu = 1.0 - alpha;
          r = p;
          prev = q;
        }
        dVar3 = log(acu * acu);
        dVar3 = sqrt(-dVar3);
        dVar3 = dVar3 - (dVar3 * 0.27061 + 2.30753) / ((dVar3 * 0.04481 + 0.99229) * dVar3 + 1.0);
        if ((prev <= 1.0) || (r <= 1.0)) {
          dVar4 = 1.0 / (r * 9.0);
          dVar5 = sqrt(dVar4);
          dVar3 = pow(dVar3 * dVar5 + (1.0 - dVar4),3.0);
          dVar3 = (r + r) * dVar3;
          if (0.0 < dVar3) {
            dVar3 = ((prev * 4.0 + r + r) - 2.0) / dVar3;
            if (1.0 < dVar3) {
              w = 1.0 - 2.0 / (dVar3 + 1.0);
            }
            else {
              dVar3 = log(acu * prev);
              w = exp((dVar3 + dVar2) / prev);
            }
          }
          else {
            dVar3 = log((1.0 - acu) * r);
            dVar3 = exp((dVar3 + dVar2) / r);
            w = 1.0 - dVar3;
          }
        }
        else {
          dVar4 = (dVar3 * dVar3 + -3.0) / 6.0;
          dVar5 = 1.0 / ((prev + prev) - 1.0);
          dVar6 = 1.0 / ((r + r) - 1.0);
          dVar7 = 2.0 / (dVar5 + dVar6);
          dVar8 = sqrt(dVar7 + dVar4);
          dVar3 = -(dVar6 - dVar5) * ((dVar4 + 0.8333333333333334) - 2.0 / (dVar7 * 3.0)) +
                  (dVar3 * dVar8) / dVar7;
          dVar3 = exp(dVar3 + dVar3);
          w = prev / (r * dVar3 + prev);
        }
        beta = 0.0;
        t = 1.0;
        qq = 1.0;
        if (w < 0.0001) {
          w = 0.0001;
        }
        if (0.9999 < w) {
          w = 0.9999;
        }
        dVar3 = pow(acu,0.2);
        dVar3 = r8_max(((-5.0 / prev) / prev - 1.0 / dVar3) - 13.0,-37.0);
        dVar4 = pow(10.0,(double)(int)dVar3);
        dVar3 = w;
        do {
          w = dVar3;
          dVar3 = betacdf(w,prev,r);
          dVar5 = log(w);
          dVar6 = log(1.0 - w);
          dVar5 = exp((1.0 - r) * dVar6 + (1.0 - prev) * dVar5 + dVar2);
          dVar5 = (dVar3 - acu) * dVar5;
          if (dVar5 * beta <= 0.0) {
            qq = r8_max(t,y_00);
          }
          h = 1.0;
          while( true ) {
            while( true ) {
              dVar3 = h * dVar5;
              t = dVar3 * dVar3;
              if (((t < qq) && (dVar3 = w - dVar3, 0.0 <= dVar3)) && (dVar3 <= 1.0)) break;
              h = h / 3.0;
            }
            if (qq <= dVar4) {
              if (bVar1) {
                w = 1.0 - w;
              }
              return w;
            }
            if (dVar5 * dVar5 <= dVar4) {
              if (bVar1) {
                w = 1.0 - w;
              }
              return w;
            }
            if (((dVar3 != 0.0) || (NAN(dVar3))) && ((dVar3 != 1.0 || (NAN(dVar3))))) break;
            h = h / 3.0;
          }
          beta = dVar5;
        } while ((dVar3 != w) || (NAN(dVar3) || NAN(w)));
        if (bVar1) {
          w = 1.0 - w;
        }
        alpha_local = w;
      }
      else {
        alpha_local = 1.0;
      }
    }
    else {
      alpha_local = 0.0;
    }
    return alpha_local;
  }
  printf("probability values must lie between 0 and 1");
  exit(1);
}

Assistant:

double betainv(double alpha, double p, double q) {
	/*
	 *   Author:

    Original FORTRAN77 version by GW Cran, KJ Martin, GE Thomas.
    C version by John Burkardt. 
    * 
    * Slightly modified to fit the rest of the code. (June 17 2013)
     
    Licensing:

    This code is distributed under the GNU LGPL license. 

    Reference:

    GW Cran, KJ Martin, GE Thomas,
    Remark AS R19 and Algorithm AS 109:
    A Remark on Algorithms AS 63: The Incomplete Beta Integral
    and AS 64: Inverse of the Incomplete Beta Integeral,
    Applied Statistics,
    Volume 26, Number 1, 1977, pages 111-114.
	 */ 
	 
  double a;
  double acu;
  double adj;
  double fpu;
  double g;
  double h;
  int iex;
  int indx;
  double pp;
  double prev;
  double qq;
  double r;
  double s;
  double sae = -37.0;
  double sq;
  double t;
  double tx;
  double value;
  double w;
  double xin;
  double y;
  double yprev;
  
  double beta;
 
  beta = beta_log(p,q);

  fpu = pow ( 10.0, sae );
  value = alpha;
  
    if ( p < 0.0 || q < 0.0 )
  {
    printf("parameters should be non-negatve and real");
    exit(1);
    
  }
  
    if ( alpha < 0.0 || 1.0 < alpha )
  {
	printf("probability values must lie between 0 and 1");
    exit(1);
  }
  
    if ( alpha == 0.0 )
  {
    value = 0.0;
    return value;
  }

  if ( alpha == 1.0 )
  {
    value = 1.0;
    return value;
  }
  

  if ( 0.5 < alpha )
  {
    a = 1.0 - alpha;
    pp = q;
    qq = p;
    indx = 1;
  }
  else
  {
    a = alpha;
    pp = p;
    qq = q;
    indx = 0;
  }

// initial approximation

  r = sqrt ( - log ( a * a ) );

  y = r - ( 2.30753 + 0.27061 * r ) 
    / ( 1.0 + ( 0.99229 + 0.04481 * r ) * r );

  if ( 1.0 < pp && 1.0 < qq )
  {
    r = ( y * y - 3.0 ) / 6.0;
    s = 1.0 / ( pp + pp - 1.0 );
    t = 1.0 / ( qq + qq - 1.0 );
    h = 2.0 / ( s + t );
    w = y * sqrt ( h + r ) / h - ( t - s ) 
      * ( r + 5.0 / 6.0 - 2.0 / ( 3.0 * h ) );
    value = pp / ( pp + qq * exp ( w + w ) );
  }
  else
  {
    r = qq + qq;
    t = 1.0 / ( 9.0 * qq );
    t = r * pow ( 1.0 - t + y * sqrt ( t ), 3 );

    if ( t <= 0.0 )
    {
      value = 1.0 - exp ( ( log ( ( 1.0 - a ) * qq ) + beta ) / qq );
    }
    else
    {
      t = ( 4.0 * pp + r - 2.0 ) / t;

      if ( t <= 1.0 )
      {
        value = exp ( ( log ( a * pp ) + beta ) / pp );
      }
      else
      {
        value = 1.0 - 2.0 / ( t + 1.0 );
      }
    }
  }

//Modified Newton-Raphson method
  r = 1.0 - pp;
  t = 1.0 - qq;
  yprev = 0.0;
  sq = 1.0;
  prev = 1.0;

  if ( value < 0.0001 )
  {
    value = 0.0001;
  }

  if ( 0.9999 < value )
  {
    value = 0.9999;
  }

  iex = (int) r8_max ( - 5.0 / pp / pp - 1.0 / pow ( a, 0.2 ) - 13.0, sae );

  acu = pow ( 10.0, iex );

  for ( ; ; )
  {
    y = betacdf( value, pp, qq);

    xin = value;
    y = ( y - a ) * exp ( beta + r * log ( xin ) + t * log ( 1.0 - xin ) );

    if ( y * yprev <= 0.0 )
    {
      prev = r8_max ( sq, fpu );
    }

    g = 1.0;

    for ( ; ; )
    {
      for ( ; ; )
      {
        adj = g * y;
        sq = adj * adj;

        if ( sq < prev )
        {
          tx = value - adj;

          if ( 0.0 <= tx && tx <= 1.0 )
          {
            break;
          }
        }
        g = g / 3.0;
      }

      if ( prev <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( y * y <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( tx != 0.0 && tx != 1.0 )
      {
        break;
      }

      g = g / 3.0;
    }

    if ( tx == value )
    {
      break;
    }

    value = tx;
    yprev = y;
  }

  if ( indx )
  {
    value = 1.0 - value;
  }

	return value;	
}